

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraceID.h
# Opt level: O3

void __thiscall
jaegertracing::TraceID::print<std::ostream>
          (TraceID *this,basic_ostream<char,_std::char_traits<char>_> *out)

{
  _func_int *p_Var1;
  char cVar2;
  uint64_t uVar3;
  _func_int **pp_Var4;
  
  uVar3 = this->_high;
  pp_Var4 = out->_vptr_basic_ostream;
  *(undefined8 *)(&out->field_0x10 + (long)pp_Var4[-3]) = 0x10;
  p_Var1 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var4[-3]);
  cVar2 = (&out->field_0xe1)[(long)pp_Var4[-3]];
  if (uVar3 != 0) {
    if (cVar2 == '\0') {
      std::ios::widen((char)p_Var1);
      p_Var1[0xe1] = (code)0x1;
      pp_Var4 = out->_vptr_basic_ostream;
    }
    p_Var1[0xe0] = (code)0x30;
    *(uint *)(&out->field_0x18 + (long)pp_Var4[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var4[-3]) & 0xffffffb5 | 8;
    out = std::ostream::_M_insert<unsigned_long>((ulong)out);
    pp_Var4 = out->_vptr_basic_ostream;
    *(undefined8 *)(&out->field_0x10 + (long)pp_Var4[-3]) = 0x10;
    p_Var1 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var4[-3]);
    cVar2 = (&out->field_0xe1)[(long)pp_Var4[-3]];
  }
  if (cVar2 == '\0') {
    std::ios::widen((char)p_Var1);
    p_Var1[0xe1] = (code)0x1;
    pp_Var4 = out->_vptr_basic_ostream;
  }
  p_Var1[0xe0] = (code)0x30;
  *(uint *)(&out->field_0x18 + (long)pp_Var4[-3]) =
       *(uint *)(&out->field_0x18 + (long)pp_Var4[-3]) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)out);
  return;
}

Assistant:

void print(Stream& out) const
    {
        if (_high == 0) {
            out << std::setw(16) << std::setfill('0') << std::hex << _low;
        }
        else {
            out << std::setw(16) << std::setfill('0') << std::hex << _high
                << std::setw(16) << std::setfill('0') << std::hex << _low;
        }
    }